

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

void collar_help(char *name)

{
  printf("usage: \n %s collar method core_mesh.ext nlayers first_thickness total_thickness mach\n",
         name);
  puts("  where method is:");
  puts("    <n>ormal extrusion normal to polygonal prism face");
  puts("    <f>lat extrusion of interpolated face edges");
  puts("    <r>adial extrusion from origin (not guarenteed)");
  puts("  --usm3d-mapbc usm3d_format.mapbc family_name bc_type");
  puts("  --fun3d-mapbc fun3d_format.mapbc (requires \'inflate\' family)");
  puts("  --rotate angle_in_degrees (applied before inflation)");
  puts("  --origin ox oy oz (default is 0 0 zmid)");
  puts("  -x output_mesh.extension");
  putchar(10);
  return;
}

Assistant:

static void collar_help(const char *name) {
  printf(
      "usage: \n %s collar method core_mesh.ext "
      "nlayers first_thickness total_thickness mach\n",
      name);
  printf("  where method is:\n");
  printf("    <n>ormal extrusion normal to polygonal prism face\n");
  printf("    <f>lat extrusion of interpolated face edges\n");
  printf("    <r>adial extrusion from origin (not guarenteed)\n");
  printf("  --usm3d-mapbc usm3d_format.mapbc family_name bc_type\n");
  printf("  --fun3d-mapbc fun3d_format.mapbc (requires 'inflate' family)\n");
  printf("  --rotate angle_in_degrees (applied before inflation)\n");
  printf("  --origin ox oy oz (default is 0 0 zmid)\n");
  printf("  -x output_mesh.extension\n");
  printf("\n");
}